

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolodetectionoutput.cpp
# Opt level: O2

void __thiscall ncnn::YoloDetectionOutput::~YoloDetectionOutput(YoloDetectionOutput *this)

{
  ~YoloDetectionOutput(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

YoloDetectionOutput::~YoloDetectionOutput()
{
    delete softmax;
}